

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O1

QSet<QtGraphicsAnchorLayout::AnchorData_*>
operator+(QSet<QtGraphicsAnchorLayout::AnchorData_*> *lhs,
         QSet<QtGraphicsAnchorLayout::AnchorData_*> *rhs)

{
  ulong uVar1;
  long *in_RDX;
  ulong uVar2;
  Data *pDVar3;
  long in_FS_OFFSET;
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> local_50;
  QHashDummyValue local_41;
  anon_struct_8_1_898a9ca8_for_storage local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d = (rhs->q_hash).d;
  if ((local_50.d != (Data *)0x0) &&
     (((local_50.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_50.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar3 = (Data *)*in_RDX;
  if (local_50.d == pDVar3) goto LAB_005d0983;
  if (pDVar3 == (Data *)0x0) {
    pDVar3 = (Data *)0x0;
LAB_005d08eb:
    uVar2 = 0;
  }
  else {
    if (pDVar3->spans->offsets[0] != 0xff) goto LAB_005d08eb;
    uVar1 = 1;
    do {
      uVar2 = uVar1;
      if (pDVar3->numBuckets == uVar2) {
        pDVar3 = (Data *)0x0;
        uVar2 = 0;
        break;
      }
      uVar1 = uVar2 + 1;
    } while (pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] == 0xff);
  }
  if (pDVar3 != (Data *)0x0 || uVar2 != 0) {
    do {
      local_40.data =
           *&pDVar3->spans[uVar2 >> 7].entries
             [pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f]].storage.data;
      QHash<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                ((QHash<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue> *)&local_50,
                 (AnchorData **)&local_40,&local_41);
      do {
        if (pDVar3->numBuckets - 1 == uVar2) {
          uVar2 = 0;
          pDVar3 = (Data *)0x0;
          break;
        }
        uVar2 = uVar2 + 1;
      } while (pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] == 0xff);
    } while (uVar2 != 0 || pDVar3 != (Data *)0x0);
  }
LAB_005d0983:
  (lhs->q_hash).d = local_50.d;
  if ((local_50.d != (Data *)0x0) &&
     (((local_50.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_50.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::~QHash(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QSet<QtGraphicsAnchorLayout::AnchorData_*>)(Hash)lhs;
}

Assistant:

friend QSet operator+(const QSet &lhs, const QSet &rhs) { return QSet(lhs) += rhs; }